

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadUSDALayerFromMemory
               (uint8_t *addr,size_t length,string *asset_name,Layer *dst_layer,string *warn,
               string *err,USDLoadOptions *options)

{
  ulong *puVar1;
  bool bVar2;
  ssize_t sVar3;
  long *plVar4;
  Layer *__nbytes;
  ulong *puVar5;
  USDAReaderConfig config;
  StreamReader sr;
  Layer layer;
  USDAReader local_1680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  USDAReaderConfig local_164c;
  StreamReader local_1648;
  undefined1 local_1628 [5560];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  if (((addr == (uint8_t *)0x0) || (length < 9)) || (dst_layer == (Layer *)0x0)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar2 = false;
  }
  else {
    local_1648.swap_endian_ = false;
    local_1648.idx_ = 0;
    __nbytes = dst_layer;
    local_1648.binary_ = addr;
    local_1648.length_ = length;
    usda::USDAReader::USDAReader(&local_1680,&local_1648);
    local_164c.strict_allowedToken_check = options->strict_allowedToken_check;
    local_164c.allow_unknown_prims = true;
    local_164c.allow_unknown_shader = true;
    local_164c.allow_unknown_apiSchema = true;
    usda::USDAReader::set_reader_config(&local_1680,&local_164c);
    sVar3 = usda::USDAReader::read(&local_1680,1,(void *)0x1,(size_t)__nbytes);
    if ((char)sVar3 == '\0') {
      if (err != (string *)0x0) {
        ::std::operator+(&local_1678,"Failed to parse USDA: ",asset_name);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1678);
        puVar1 = (ulong *)(local_1628 + 0x10);
        puVar5 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar5) {
          local_1628._16_8_ = *puVar5;
          local_1628._24_8_ = plVar4[3];
          local_1628._0_8_ = puVar1;
        }
        else {
          local_1628._16_8_ = *puVar5;
          local_1628._0_8_ = (ulong *)*plVar4;
        }
        local_1628._8_8_ = plVar4[1];
        *plVar4 = (long)puVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,local_1628._0_8_);
        if ((ulong *)local_1628._0_8_ != puVar1) {
          operator_delete((void *)local_1628._0_8_,local_1628._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
          operator_delete(local_1678._M_dataplus._M_p,
                          (ulong)(local_1678.field_2._M_allocated_capacity + 1));
        }
        usda::USDAReader::get_error_abi_cxx11_((string *)&local_1678,&local_1680);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1678);
        puVar5 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar5) {
          local_1628._16_8_ = *puVar5;
          local_1628._24_8_ = plVar4[3];
          local_1628._0_8_ = puVar1;
        }
        else {
          local_1628._16_8_ = *puVar5;
          local_1628._0_8_ = (ulong *)*plVar4;
        }
        local_1628._8_8_ = plVar4[1];
        *plVar4 = (long)puVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,local_1628._0_8_);
        if ((ulong *)local_1628._0_8_ != puVar1) {
          operator_delete((void *)local_1628._0_8_,local_1628._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
          operator_delete(local_1678._M_dataplus._M_p,
                          (ulong)(local_1678.field_2._M_allocated_capacity + 1));
        }
      }
      bVar2 = false;
    }
    else {
      local_1628._0_8_ = local_1628 + 0x10;
      local_1628._8_8_ = 0;
      local_1628._16_8_ = local_1628._16_8_ & 0xffffffffffffff00;
      local_1628._32_8_ = local_1628 + 0x50;
      local_1628._40_8_ = 1;
      local_1628._48_8_ = (_Hash_node_base *)0x0;
      local_1628._56_8_ = 0;
      local_1628._64_4_ = 1.0;
      local_1628._72_8_ = 0;
      local_1628._80_8_ = (__node_base_ptr)0x0;
      LayerMetas::LayerMetas((LayerMetas *)(local_1628 + 0x58));
      local_1628._5528_8_ = local_1628 + 0x1588;
      local_1628._5512_4_ = _S_red;
      local_1628._5520_8_ = (_Link_type)0x0;
      local_1628._5544_8_ = 0;
      local_1628[0x15b0] = true;
      local_1628[0x15b1] = true;
      local_1628[0x15b2] = true;
      local_1628[0x15b3] = true;
      local_1628[0x15b4] = true;
      local_1628[0x15b5] = true;
      local_1628[0x15b6] = true;
      local_1628[0x15b7] = true;
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvStack_38 = (void *)0x0;
      local_1628._5536_8_ = local_1628._5528_8_;
      local_70._M_p = (pointer)&local_60;
      bVar2 = usda::USDAReader::get_as_layer(&local_1680,(Layer *)local_1628);
      if (bVar2) {
        if (warn != (string *)0x0) {
          usda::USDAReader::get_warning_abi_cxx11_((string *)&local_1678,&local_1680);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
            operator_delete(local_1678._M_dataplus._M_p,
                            (ulong)(local_1678.field_2._M_allocated_capacity + 1));
          }
          if ((pointer)local_1678._M_string_length != (pointer)0x0) {
            usda::USDAReader::get_warning_abi_cxx11_((string *)&local_1678,&local_1680);
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1678._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
              operator_delete(local_1678._M_dataplus._M_p,
                              (ulong)(local_1678.field_2._M_allocated_capacity + 1));
            }
          }
        }
        ::std::__cxx11::string::operator=((string *)dst_layer,(string *)local_1628);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&dst_layer->_prim_specs,local_1628 + 0x20);
        LayerMetas::operator=(&dst_layer->_metas,(LayerMetas *)(local_1628 + 0x58));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                     *)&dst_layer->_primspec_path_cache,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                     *)(local_1628 + 0x1580));
        dst_layer->_dirty = (bool)local_1628[0x15b0];
        dst_layer->_has_unresolved_references = (bool)local_1628[0x15b1];
        dst_layer->_has_unresolved_payload = (bool)local_1628[0x15b2];
        dst_layer->_has_unresolved_variant = (bool)local_1628[0x15b3];
        dst_layer->_has_unresolved_inherits = (bool)local_1628[0x15b4];
        dst_layer->_has_unresolved_specializes = (bool)local_1628[0x15b5];
        dst_layer->_has_over_primspec = (bool)local_1628[0x15b6];
        dst_layer->_has_class_primspec = (bool)local_1628[0x15b7];
        ::std::__cxx11::string::operator=
                  ((string *)&dst_layer->_current_working_path,(string *)&local_70);
        local_1678._M_dataplus._M_p =
             (pointer)(dst_layer->_asset_search_paths).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_1678._M_string_length =
             (size_type)
             (dst_layer->_asset_search_paths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1678.field_2._M_allocated_capacity =
             (size_type)
             (dst_layer->_asset_search_paths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (dst_layer->_asset_search_paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (dst_layer->_asset_search_paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (dst_layer->_asset_search_paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_50.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1678);
        dst_layer->_asset_resolution_userdata = pvStack_38;
      }
      else if (err != (string *)0x0) {
        usda::USDAReader::get_error_abi_cxx11_((string *)&local_1678,&local_1680);
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1678._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
          operator_delete(local_1678._M_dataplus._M_p,
                          (ulong)(local_1678.field_2._M_allocated_capacity + 1));
        }
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,
                        CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1)
        ;
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                  *)(local_1628 + 0x1580),(_Link_type)local_1628._5520_8_);
      LayerMetas::~LayerMetas((LayerMetas *)(local_1628 + 0x58));
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_1628 + 0x20));
      if ((undefined1 *)local_1628._0_8_ != local_1628 + 0x10) {
        operator_delete((void *)local_1628._0_8_,local_1628._16_8_ + 1);
      }
    }
    usda::USDAReader::~USDAReader(&local_1680);
  }
  return bVar2;
}

Assistant:

bool LoadUSDALayerFromMemory(const uint8_t *addr, const size_t length,
                       const std::string &asset_name, Layer *dst_layer,
                       std::string *warn, std::string *err,
                       const USDLoadOptions &options) {

  // TODO: options
  (void)options;

  if (!addr) {
    if (err) {
      (*err) += "addr arg is nullptr.\n";
    }
    return false;
  }

  if (length < 9) {
    if (err) {
      (*err) += "Input too short.\n";
    }
    return false;
  }

  if (!dst_layer) {
    if (err) {
      (*err) += "dst_layher arg is nullptr.\n";
    }
    return false;
  }

  tinyusdz::StreamReader sr(addr, length, /* swap endian */ false);
  tinyusdz::usda::USDAReader reader(&sr);

  tinyusdz::usda::USDAReaderConfig config;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  reader.set_reader_config(config);

  uint32_t load_states = static_cast<uint32_t>(tinyusdz::LoadState::Toplevel);

  bool as_primspec = true;

  {
    bool ret = reader.read(load_states, as_primspec);

    if (!ret) {
      if (err) {
        (*err) += "Failed to parse USDA: " + asset_name + "\n";
        (*err) += reader.get_error() + "\n";
      }
      return false;
    }
  }

  tinyusdz::Layer layer;
  bool ret = reader.get_as_layer(&layer);
  if (!ret) {
    if (err) {
      (*err) += reader.get_error();
    }
    return false;
  }

  if (warn) {
    if (reader.get_warning().size()) {
      (*warn) += reader.get_warning();
    }
  }

  (*dst_layer) = std::move(layer);

  return true;
}